

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

size_t mtbdd_nodecount_mark(MTBDD mtbdd)

{
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ulong *puVar5;
  
  lVar4 = (mtbdd & 0xffffffffff) * 0x10;
  uVar1 = *(ulong *)(nodes->data + lVar4);
  if ((uVar1 >> 0x3d & 1) == 0) {
    puVar5 = (ulong *)(nodes->data + lVar4);
    lVar4 = 0;
    do {
      *puVar5 = uVar1 | 0x2000000000000000;
      if ((uVar1 >> 0x3e & 1) != 0) {
        lVar3 = 1;
        goto LAB_0010d1ad;
      }
      sVar2 = mtbdd_nodecount_mark(puVar5[1] & 0xffffffffff);
      lVar4 = lVar4 + 1 + sVar2;
      lVar3 = (*puVar5 & 0xffffffffff) * 0x10;
      puVar5 = (ulong *)(nodes->data + lVar3);
      uVar1 = *(ulong *)(nodes->data + lVar3);
    } while ((uVar1 & 0x2000000000000000) == 0);
    lVar3 = 0;
LAB_0010d1ad:
    sVar2 = lVar4 + lVar3;
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

static size_t
mtbdd_nodecount_mark(MTBDD mtbdd)
{
    mtbddnode_t n = MTBDD_GETNODE(mtbdd);
    if (mtbddnode_getmark(n)) return 0;
    mtbddnode_setmark(n, 1);
    if (mtbddnode_isleaf(n)) return 1; // count leaf as 1
    return 1 + mtbdd_nodecount_mark(mtbddnode_getlow(n)) + mtbdd_nodecount_mark(mtbddnode_gethigh(n));
}